

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

Message * __thiscall
google::protobuf::internal::GeneratedMessageReflection::ReleaseLast
          (GeneratedMessageReflection *this,Message *message,FieldDescriptor *field)

{
  int iVar1;
  long lVar2;
  int iVar3;
  LogMessage *pLVar4;
  MessageLite *pMVar5;
  long lVar6;
  LogFinisher local_59;
  LogMessage local_58;
  
  if (*(Descriptor **)(field + 0x38) != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"ReleaseLast","Field does not match message type.");
  }
  if (*(int *)(field + 0x30) != 3) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"ReleaseLast",
               "Field is singular; the method requires a repeated field.");
  }
  if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x2c) * 4) != 10) {
    anon_unknown_0::ReportReflectionUsageTypeError
              (this->descriptor_,field,"ReleaseLast",CPPTYPE_MESSAGE);
  }
  if (field[0x34] == (FieldDescriptor)0x1) {
    iVar3 = this->extensions_offset_;
    if (iVar3 == -1) {
      LogMessage::LogMessage
                (&local_58,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
                 ,0x4b5);
      pLVar4 = LogMessage::operator<<(&local_58,"CHECK failed: (extensions_offset_) != (-1): ");
      LogFinisher::operator=(&local_59,pLVar4);
      LogMessage::~LogMessage(&local_58);
      iVar3 = this->extensions_offset_;
    }
    pMVar5 = ExtensionSet::ReleaseLast
                       ((ExtensionSet *)
                        ((long)&(message->super_MessageLite)._vptr_MessageLite + (long)iVar3),
                        *(int *)(field + 0x28));
  }
  else {
    lVar6 = (long)this->offsets_
                  [(int)((ulong)((long)field - *(long *)(*(long *)(field + 0x38) + 0x30)) >> 3) *
                   -0x11111111];
    iVar3 = *(int *)((long)&message[1].super_MessageLite._vptr_MessageLite + lVar6);
    if (iVar3 < 1) {
      LogMessage::LogMessage
                (&local_58,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/repeated_field.h"
                 ,0x3bb);
      pLVar4 = LogMessage::operator<<(&local_58,"CHECK failed: (current_size_) > (0): ");
      LogFinisher::operator=(&local_59,pLVar4);
      LogMessage::~LogMessage(&local_58);
      iVar3 = *(int *)((long)&message[1].super_MessageLite._vptr_MessageLite + lVar6);
    }
    lVar2 = *(long *)((long)&(message->super_MessageLite)._vptr_MessageLite + lVar6);
    *(int *)((long)&message[1].super_MessageLite._vptr_MessageLite + lVar6) = iVar3 + -1;
    pMVar5 = *(MessageLite **)(lVar2 + -8 + (long)iVar3 * 8);
    iVar1 = *(int *)((long)&message[1].super_MessageLite._vptr_MessageLite + lVar6 + 4);
    *(int *)((long)&message[1].super_MessageLite._vptr_MessageLite + lVar6 + 4) = iVar1 + -1;
    if (iVar3 < iVar1) {
      *(undefined8 *)(lVar2 + ((long)iVar3 + -1) * 8) =
           *(undefined8 *)(lVar2 + -8 + (long)iVar1 * 8);
    }
  }
  return (Message *)pMVar5;
}

Assistant:

Message* GeneratedMessageReflection::ReleaseLast(
    Message* message,
    const FieldDescriptor* field) const {
  USAGE_CHECK_ALL(ReleaseLast, REPEATED, MESSAGE);

  if (field->is_extension()) {
    return static_cast<Message*>(
        MutableExtensionSet(message)->ReleaseLast(field->number()));
  } else {
    return MutableRaw<RepeatedPtrFieldBase>(message, field)
        ->ReleaseLast<GenericTypeHandler<Message> >();
  }
}